

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::UserDefinedIOCase::iterate(UserDefinedIOCase *this)

{
  ostringstream *this_00;
  IVec3 *this_01;
  IOType IVar1;
  TextureFormat log;
  Archive *archive;
  pointer pSVar2;
  TopLevelObject *pTVar3;
  bool bVar4;
  int iVar5;
  deUint32 dVar6;
  uint uVar7;
  GLenum GVar8;
  int iVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Functions *gl;
  void *pvVar10;
  char *__rhs;
  ulong uVar11;
  MessageBuilder *this_02;
  TestError *this_03;
  int iVar12;
  RenderContext *pRVar13;
  uint uVar14;
  ulong uVar15;
  int currentIndex;
  int result_1;
  uint uVar16;
  long lVar17;
  RenderContext *pRVar18;
  int i;
  long lVar19;
  Result tfResult;
  ConstPixelBufferAccess local_3b0;
  RenderContext *local_388;
  deUint32 local_380;
  int numBytes;
  RandomViewport viewport;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_368;
  Surface pixels;
  ConstPixelBufferAccess local_330;
  TFHandler tfHandler;
  string local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  ResultCollector result;
  TextureLevel reference;
  VertexArrayBinding bindings [1];
  undefined4 extraout_var_02;
  
  log = (TextureFormat)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  pRVar13 = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar5 = (*pRVar13->_vptr_RenderContext[4])(pRVar13);
  dVar6 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            (&viewport,(RenderTarget *)CONCAT44(extraout_var,iVar5),0x100,0x100,dVar6);
  iVar5 = (*pRVar13->_vptr_RenderContext[3])(pRVar13);
  lVar17 = CONCAT44(extraout_var_00,iVar5);
  dVar6 = (((this->m_program).m_ptr)->m_program).m_program;
  uVar7 = referenceVertexCount
                    (this->m_primitiveType,SPACINGMODE_EQUAL,false,iterate::attributes,
                     iterate::attributes + 2);
  tfHandler.m_renderCtx = pRVar13;
  glu::TypedObjectWrapper<(glu::ObjectType)4>::TypedObjectWrapper(&tfHandler.m_tf,pRVar13);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper(&tfHandler.m_tfBuffer,pRVar13);
  local_388 = pRVar13;
  glu::TypedObjectWrapper<(glu::ObjectType)6>::TypedObjectWrapper(&tfHandler.m_tfPrimQuery,pRVar13);
  iVar5 = (*(tfHandler.m_renderCtx)->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var_01,iVar5) + 0x40))
            (0x8c8e,tfHandler.m_tfBuffer.super_ObjectWrapper.m_object);
  (**(code **)(CONCAT44(extraout_var_01,iVar5) + 0x150))
            (0x8c8e,(long)(int)(uVar7 * 4 + 0xc),0,0x88e9);
  tcu::ResultCollector::ResultCollector(&result);
  (**(code **)(lVar17 + 0x1680))(dVar6);
  (**(code **)(lVar17 + 0x1a00))(viewport.x,viewport.y,viewport.width,viewport.height);
  (**(code **)(lVar17 + 0xfd8))(0x8e72,10);
  (**(code **)(lVar17 + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(lVar17 + 0x188))(0x4000);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&reference,"in_v_attr",(allocator<char> *)&local_3b0);
  glu::va::Float(bindings,(string *)&reference,1,10,0,iterate::attributes);
  std::__cxx11::string::~string((string *)&reference);
  if ((ulong)this->m_primitiveType < 3) {
    uVar14 = *(uint *)(&DAT_01890e10 + (ulong)this->m_primitiveType * 4);
  }
  else {
    uVar14 = 0xffffffff;
  }
  iVar5 = (*(tfHandler.m_renderCtx)->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var_02,iVar5);
  (*gl->bindTransformFeedback)(0x8e22,tfHandler.m_tf.super_ObjectWrapper.m_object);
  (*gl->bindBuffer)(0x8c8e,tfHandler.m_tfBuffer.super_ObjectWrapper.m_object);
  (*gl->bindBufferBase)(0x8c8e,0,tfHandler.m_tfBuffer.super_ObjectWrapper.m_object);
  (*gl->beginQuery)(0x8c88,tfHandler.m_tfPrimQuery.super_ObjectWrapper.m_object);
  (*gl->beginTransformFeedback)(uVar14);
  reference.m_format.order = RGB;
  reference.m_format.type = UNORM_SHORT_4444;
  reference.m_size.m_data[0] = 3;
  reference.m_size.m_data[2] = 0;
  reference._20_4_ = 0;
  glu::draw(tfHandler.m_renderCtx,dVar6,1,bindings,(PrimitiveList *)&reference,
            (DrawUtilCallback *)0x0);
  GVar8 = (*gl->getError)();
  glu::checkError(GVar8,"Draw failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
                  ,0x15e);
  (*gl->endTransformFeedback)();
  (*gl->endQuery)(0x8c88);
  local_380 = getQueryResult(gl,tfHandler.m_tfPrimQuery.super_ObjectWrapper.m_object);
  if (uVar14 < 5) {
    iVar5 = *(int *)(&DAT_01890e1c + (ulong)uVar14 * 4);
  }
  else {
    iVar5 = -1;
  }
  uVar14 = iVar5 * local_380;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_368,(long)(int)uVar14,
             (allocator_type *)&reference);
  numBytes = uVar14 * 4;
  pvVar10 = (*gl->mapBufferRange)(0x8c8e,0,(long)numBytes,1);
  GVar8 = (*gl->getError)();
  local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
  local_298._M_string_length = 0;
  local_298.field_2._M_local_buf[0] = '\0';
  std::operator+(&local_278,&local_298,"glMapBufferRange(");
  __rhs = glu::getBufferTargetName(0x8c8e);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pixels,
                 &local_278,__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_330,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pixels,
                 ", 0, ");
  de::toString<int>(&local_2b8,&numBytes);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_3b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_330,
                 &local_2b8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reference,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_3b0,
                 ", GL_MAP_READ_BIT)");
  glu::checkError(GVar8,(char *)reference.m_format,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
                  ,0x10d);
  std::__cxx11::string::~string((string *)&reference);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::string::~string((string *)&pixels);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)&local_298);
  if (pvVar10 == (void *)0x0) {
    this_03 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_03,(char *)0x0,"mappedData != DE_NULL",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
               ,0x10e);
    __cxa_throw(this_03,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  uVar11 = 0;
  uVar15 = (ulong)uVar14;
  if ((int)uVar14 < 1) {
    uVar15 = uVar11;
  }
  for (; uVar15 != uVar11; uVar11 = uVar11 + 1) {
    local_368._M_impl.super__Vector_impl_data._M_start[uVar11] =
         *(uint *)((long)pvVar10 + uVar11 * 4);
  }
  (*gl->unmapBuffer)(0x8c8e);
  tfResult.numPrimitives = local_380;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&tfResult.varying,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_368);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_368);
  getPixels(&pixels,local_388,&viewport);
  archive = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_curArchive;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3b0,(this->m_referenceImagePath)._M_dataplus._M_p,
             (allocator<char> *)&local_330);
  getPNG(&reference,archive,(string *)&local_3b0);
  std::__cxx11::string::~string((string *)&local_3b0);
  tcu::TextureLevel::getAccess(&local_3b0,&reference);
  tcu::Surface::getAccess(&local_330,&pixels);
  bVar4 = tcu::fuzzyCompare((TestLog *)log,"ImageComparison","Image Comparison",&local_3b0,
                            &local_330,0.02,COMPARE_LOG_RESULT);
  if (!bVar4) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3b0,"Image comparison failed",(allocator<char> *)&local_330);
    tcu::ResultCollector::fail(&result,(string *)&local_3b0);
    std::__cxx11::string::~string((string *)&local_3b0);
  }
  tcu::TextureLevel::~TextureLevel(&reference);
  tcu::Surface::~Surface(&pixels);
  if (uVar7 == (uint)((ulong)((long)tfResult.varying.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)tfResult.varying.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start) >> 2)) {
    IVar1 = this->m_ioType;
    if ((ulong)IVar1 < 3) {
      uVar14 = *(uint *)(&DAT_01890e30 + (ulong)IVar1 * 4);
    }
    else {
      uVar14 = (uint)(IVar1 != IO_TYPE_PER_PATCH_BLOCK_ARRAY) * 3 + 2;
    }
    lVar17 = 0;
    iVar5 = 0;
    for (lVar19 = 0;
        pSVar2 = (this->m_tesInputs).
                 super__Vector_base<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>,_std::allocator<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        lVar19 < (int)((ulong)((long)(this->m_tesInputs).
                                     super__Vector_base<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>,_std::allocator<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar2) >> 4
                      ); lVar19 = lVar19 + 1) {
      iVar9 = (**(code **)(**(long **)((long)&pSVar2->m_ptr + lVar17) + 0x38))();
      iVar5 = iVar5 + iVar9;
      lVar17 = lVar17 + 0x10;
    }
    uVar16 = iVar5 * uVar14;
    pRVar18 = (RenderContext *)0x0;
    pRVar13 = (RenderContext *)(ulong)uVar7;
    local_388 = (RenderContext *)(ulong)uVar7;
    if ((int)uVar7 < 1) {
      pRVar13 = pRVar18;
      local_388 = pRVar18;
    }
    for (; pRVar18 != pRVar13; pRVar18 = (RenderContext *)((long)&pRVar18->_vptr_RenderContext + 1))
    {
      if (uVar16 < tfResult.varying.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start[(long)pRVar18]) {
        reference.m_format = log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&reference.m_size);
        std::operator<<((ostream *)&reference.m_size,
                        "Failure: out_te_firstFailedInputIndex has value ");
        this_02 = tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)&reference,
                             tfResult.varying.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start + (long)pRVar18);
        this_00 = &this_02->m_str;
        std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,
                        ", should be in range [0, ");
        std::ostream::operator<<(this_00,uVar16);
        std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,"]");
        tcu::MessageBuilder::operator<<(this_02,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&reference.m_size);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&reference,"Invalid transform feedback output",
                   (allocator<char> *)&local_3b0);
        tcu::ResultCollector::fail(&result,(string *)&reference);
LAB_01222910:
        std::__cxx11::string::~string((string *)&reference);
      }
      else if (tfResult.varying.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start[(long)pRVar18] != uVar16) {
        reference.m_format = log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&reference.m_size);
        std::operator<<((ostream *)&reference.m_size,
                        "Failure: in tessellation evaluation shader, check for input ");
        uVar7 = tfResult.varying.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start[(long)pRVar18];
        iVar9 = 0;
        iVar5 = -1;
        while (iVar12 = iVar5 + 1, iVar9 < (int)uVar7) {
          iVar5 = (*((this->m_tesInputs).
                     super__Vector_base<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>,_std::allocator<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[iVar12].m_ptr)->_vptr_TopLevelObject
                    [7])();
          iVar9 = iVar9 + iVar5 * uVar14;
          iVar5 = iVar12;
        }
        if ((int)uVar7 < iVar9) {
          lVar17 = (long)iVar5;
          iVar5 = (*((this->m_tesInputs).
                     super__Vector_base<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>,_std::allocator<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar17].m_ptr)->_vptr_TopLevelObject
                    [7])();
          iVar9 = iVar9 - iVar5 * uVar14;
        }
        else {
          lVar17 = (long)iVar12;
        }
        pTVar3 = (this->m_tesInputs).
                 super__Vector_base<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>,_std::allocator<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar17].m_ptr;
        (*pTVar3->_vptr_TopLevelObject[8])(&local_3b0,pTVar3,(ulong)(uVar7 - iVar9),(ulong)uVar14);
        std::operator<<((ostream *)&reference.m_size,(string *)&local_3b0);
        std::operator<<((ostream *)&reference.m_size," failed");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&reference,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::string::~string((string *)&local_3b0);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&reference.m_size);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&reference,"Invalid input value in tessellation evaluation shader",
                   (allocator<char> *)&local_3b0);
        pRVar13 = local_388;
        tcu::ResultCollector::fail(&result,(string *)&reference);
        goto LAB_01222910;
      }
    }
  }
  else {
    this_01 = &reference.m_size;
    reference.m_format = log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this_01);
    std::operator<<((ostream *)this_01,"Failure: transform feedback returned ");
    std::ostream::_M_insert<unsigned_long>((ulong)this_01);
    std::operator<<((ostream *)this_01," vertices; expected ");
    std::ostream::operator<<(this_01,uVar7);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&reference,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_01);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&reference,"Wrong number of vertices",(allocator<char> *)&local_3b0);
    tcu::ResultCollector::fail(&result,(string *)&reference);
    std::__cxx11::string::~string((string *)&reference);
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&tfResult.varying.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::__cxx11::string::~string((string *)&bindings[0].binding.name);
  tcu::ResultCollector::setTestContextResult
            (&result,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::ResultCollector::~ResultCollector(&result);
  TransformFeedbackHandler<unsigned_int>::~TransformFeedbackHandler(&tfHandler);
  return STOP;
}

Assistant:

UserDefinedIOCase::IterateResult UserDefinedIOCase::iterate (void)
{
	typedef TransformFeedbackHandler<deUint32> TFHandler;

	TestLog&				log						= m_testCtx.getLog();
	const RenderContext&	renderCtx				= m_context.getRenderContext();
	const RandomViewport	viewport				(renderCtx.getRenderTarget(), RENDER_SIZE, RENDER_SIZE, deStringHash(getName()));
	const glw::Functions&	gl						= renderCtx.getFunctions();
	static const float		attributes[6+2+2]		= { /* inner */ 3.0f, 4.0f, /* outer */ 5.0f, 6.0f, 7.0f, 8.0f, /* pos. scale */ 1.2f, 1.3f, /* pos. offset */ -0.3f, -0.4f };
	const deUint32			programGL				= m_program->getProgram();
	const int				numVertices				= referenceVertexCount(m_primitiveType, SPACINGMODE_EQUAL, false, &attributes[0], &attributes[2]);
	const TFHandler			tfHandler				(renderCtx, numVertices);
	tcu::ResultCollector	result;

	gl.useProgram(programGL);
	setViewport(gl, viewport);
	gl.patchParameteri(GL_PATCH_VERTICES, DE_LENGTH_OF_ARRAY(attributes));

	gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
	gl.clear(GL_COLOR_BUFFER_BIT);

	{
		const glu::VertexArrayBinding	bindings[]	= { glu::va::Float("in_v_attr", 1, DE_LENGTH_OF_ARRAY(attributes), 0, &attributes[0]) };
		const TFHandler::Result			tfResult	= tfHandler.renderAndGetPrimitives(programGL, outputPrimitiveTypeGL(m_primitiveType, false),
																					   DE_LENGTH_OF_ARRAY(bindings), &bindings[0], DE_LENGTH_OF_ARRAY(attributes));

		{
			const tcu::Surface			pixels		= getPixels(renderCtx, viewport);
			const tcu::TextureLevel		reference	= getPNG(m_testCtx.getArchive(), m_referenceImagePath.c_str());
			const bool					success		= tcu::fuzzyCompare(log, "ImageComparison", "Image Comparison", reference.getAccess(), pixels.getAccess(), 0.02f, tcu::COMPARE_LOG_RESULT);

			if (!success)
				result.fail("Image comparison failed");
		}

		if ((int)tfResult.varying.size() != numVertices)
		{
			log << TestLog::Message << "Failure: transform feedback returned " << tfResult.varying.size() << " vertices; expected " << numVertices << TestLog::EndMessage;
			result.fail("Wrong number of vertices");
		}
		else
		{
			const int topLevelArraySize		= (m_ioType == IO_TYPE_PER_PATCH				? 1
											 : m_ioType == IO_TYPE_PER_PATCH_ARRAY			? NUM_PER_PATCH_ARRAY_ELEMS
											 : m_ioType == IO_TYPE_PER_PATCH_BLOCK			? 1
											 : m_ioType == IO_TYPE_PER_PATCH_BLOCK_ARRAY	? NUM_PER_PATCH_BLOCKS
											 : (int)NUM_OUTPUT_VERTICES);
			const int numTEInputs			= numBasicSubobjectsInElementType(m_tesInputs) * topLevelArraySize;

			for (int vertexNdx = 0; vertexNdx < (int)numVertices; vertexNdx++)
			{
				if (tfResult.varying[vertexNdx] > (deUint32)numTEInputs)
				{
					log << TestLog::Message << "Failure: out_te_firstFailedInputIndex has value " << tfResult.varying[vertexNdx]
											<< ", should be in range [0, " << numTEInputs << "]" << TestLog::EndMessage;
					result.fail("Invalid transform feedback output");
				}
				else if (tfResult.varying[vertexNdx] != (deUint32)numTEInputs)
				{
					log << TestLog::Message << "Failure: in tessellation evaluation shader, check for input "
											<< basicSubobjectAtIndex(tfResult.varying[vertexNdx], m_tesInputs, topLevelArraySize) << " failed" << TestLog::EndMessage;
					result.fail("Invalid input value in tessellation evaluation shader");
				}
			}
		}
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}